

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LLT.h
# Opt level: O2

LLT<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> * __thiscall
Eigen::LLT<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::compute
          (LLT<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *this,MatrixType *a)

{
  long nbRows;
  bool bVar1;
  
  nbRows = (a->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows;
  if (nbRows == (a->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
                m_cols) {
    PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::resize
              ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)this,nbRows,nbRows);
    PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
    lazyAssign<Eigen::Matrix<double,_1,_1,0,_1,_1>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)this,
               (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)a);
    this->m_isInitialized = true;
    bVar1 = internal::LLT_Traits<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::inplace_decomposition
                      (&this->m_matrix);
    this->m_info = (uint)!bVar1;
    return this;
  }
  __assert_fail("a.rows()==a.cols()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/preritj[P]Unscented-Kalman-Filter/src/Eigen/src/Cholesky/LLT.h"
                ,0x18b,
                "LLT<MatrixType, _UpLo> &Eigen::LLT<Eigen::Matrix<double, -1, -1>>::compute(const MatrixType &) [MatrixType = Eigen::Matrix<double, -1, -1>, UpLo = 1]"
               );
}

Assistant:

static typename MatrixType::Index blocked(MatrixType& m)
  {
    typedef typename MatrixType::Index Index;
    eigen_assert(m.rows()==m.cols());
    Index size = m.rows();
    if(size<32)
      return unblocked(m);

    Index blockSize = size/8;
    blockSize = (blockSize/16)*16;
    blockSize = (std::min)((std::max)(blockSize,Index(8)), Index(128));

    for (Index k=0; k<size; k+=blockSize)
    {
      // partition the matrix:
      //       A00 |  -  |  -
      // lu  = A10 | A11 |  -
      //       A20 | A21 | A22
      Index bs = (std::min)(blockSize, size-k);
      Index rs = size - k - bs;
      Block<MatrixType,Dynamic,Dynamic> A11(m,k,   k,   bs,bs);
      Block<MatrixType,Dynamic,Dynamic> A21(m,k+bs,k,   rs,bs);
      Block<MatrixType,Dynamic,Dynamic> A22(m,k+bs,k+bs,rs,rs);

      Index ret;
      if((ret=unblocked(A11))>=0) return k+ret;
      if(rs>0) A11.adjoint().template triangularView<Upper>().template solveInPlace<OnTheRight>(A21);
      if(rs>0) A22.template selfadjointView<Lower>().rankUpdate(A21,-1); // bottleneck
    }
    return -1;
  }